

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdLine.h
# Opt level: O1

void __thiscall TCLAP::CmdLine::xorAdd(CmdLine *this,Arg *a,Arg *b)

{
  vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_> ors;
  void *local_38;
  undefined8 uStack_30;
  long local_28;
  Arg *local_18;
  
  local_38 = (void *)0x0;
  uStack_30 = 0;
  local_28 = 0;
  local_18 = a;
  std::vector<TCLAP::Arg*,std::allocator<TCLAP::Arg*>>::emplace_back<TCLAP::Arg*>
            ((vector<TCLAP::Arg*,std::allocator<TCLAP::Arg*>> *)&local_38,&local_18);
  local_18 = b;
  std::vector<TCLAP::Arg*,std::allocator<TCLAP::Arg*>>::emplace_back<TCLAP::Arg*>
            ((vector<TCLAP::Arg*,std::allocator<TCLAP::Arg*>> *)&local_38,&local_18);
  (*(this->super_CmdLineInterface)._vptr_CmdLineInterface[5])(this,&local_38);
  if (local_38 != (void *)0x0) {
    operator_delete(local_38,local_28 - (long)local_38);
  }
  return;
}

Assistant:

inline void CmdLine::xorAdd( Arg& a, Arg& b )
{
	std::vector<Arg*> ors;
	ors.push_back( &a );
	ors.push_back( &b );
	xorAdd( ors );
}